

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_request.cpp
# Opt level: O2

int __thiscall HTTPRequest::parse_header_line(HTTPRequest *this,char *str,ssize_t size)

{
  int iVar1;
  long lVar2;
  long lVar3;
  mapped_type *this_00;
  long lVar4;
  char *pcVar5;
  key_type local_58;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  lVar4 = 1;
  pcVar5 = str;
  lVar2 = lVar4;
  if (1 < size) {
    lVar2 = size;
  }
  for (; (lVar3 = lVar2, lVar4 < size && ((*pcVar5 != ':' || (lVar3 = lVar4, pcVar5[1] != ' '))));
      pcVar5 = pcVar5 + 1) {
    lVar4 = lVar4 + 1;
  }
  if (lVar3 == size) {
    iVar1 = -1;
  }
  else {
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_38,pcVar5 + 2,str + size);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,str,pcVar5);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->header,&local_58);
    std::__cxx11::string::operator=((string *)this_00,(string *)local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)local_38);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int HTTPRequest::parse_header_line(const char *str, ssize_t size) {
    ssize_t i = size;
    for (i = 0; i + 1 < size; i++) {
        if (str[i] == ':' && str[i + 1] == ' ') {
            break;
        }
    }
    if (i + 1 == size) {
        return -1;
    } else {
        this->header[std::string(str, i * sizeof(char))] = std::string(str + i + 2, (size - i - 2) * sizeof(char));
        return 0;
    }
}